

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O1

void __thiscall
unodb::detail::
key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
::prepend(key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
          *this,key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                *prefix1,byte prefix2)

{
  byte bVar1;
  byte bVar2;
  
  if (((byte)this[7] < 8) &&
     (bVar1 = (prefix1->f).key_prefix_length.value.super___atomic_base<unsigned_char>._M_i,
     bVar1 < 8)) {
    if (6 < (byte)(bVar1 + (char)this[7])) {
      __assert_fail("length() + prefix1.length() < key_prefix_capacity",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                    ,0x2a8,
                    "void unodb::detail::key_prefix<unodb::detail::basic_art_key<std::span<const std::byte>>, unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::critical_section_policy>::prepend(const key_prefix<ArtKey, CriticalSectionPolicy> &, std::byte) [ArtKey = unodb::detail::basic_art_key<std::span<const std::byte>>, CriticalSectionPolicy = unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::critical_section_policy]"
                   );
    }
    bVar1 = *(byte *)((long)&(prefix1->u64).value.super___atomic_base<unsigned_long>._M_i + 7);
    if ((bVar1 < 8) && ((byte)this[7] < 8)) {
      bVar1 = bVar1 * '\b';
      if (((byte)this[7] < 8) &&
         (bVar2 = (prefix1->f).key_prefix_length.value.super___atomic_base<unsigned_char>._M_i,
         bVar2 < 8)) {
        bVar2 = bVar2 + (char)this[7];
        if (6 < bVar2) {
          __assert_fail("length <= key_prefix_capacity",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                        ,0x2d2,
                        "static std::uint64_t unodb::detail::key_prefix<unodb::detail::basic_art_key<std::span<const std::byte>>, unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::critical_section_policy>::length_to_word(unsigned int) [ArtKey = unodb::detail::basic_art_key<std::span<const std::byte>>, CriticalSectionPolicy = unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::critical_section_policy]"
                       );
        }
        *(ulong *)this =
             (ulong)(byte)(bVar2 + 1) << 0x38 |
             (*(ulong *)this & ~(-1L << (((byte)this[7] & 7) << 3))) << (bVar1 + 8 & 0x3f) |
             (ulong)prefix2 << (bVar1 & 0x3f) | (ulong)*prefix1 & ~(-1L << (bVar1 & 0x3f));
        if ((byte)this[7] < 8) {
          return;
        }
        __assert_fail("f.key_prefix_length.load() <= key_prefix_capacity",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                      ,0x2b7,
                      "void unodb::detail::key_prefix<unodb::detail::basic_art_key<std::span<const std::byte>>, unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::critical_section_policy>::prepend(const key_prefix<ArtKey, CriticalSectionPolicy> &, std::byte) [ArtKey = unodb::detail::basic_art_key<std::span<const std::byte>>, CriticalSectionPolicy = unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::critical_section_policy]"
                     );
      }
    }
  }
  __assert_fail("result <= key_prefix_capacity",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                ,0x298,
                "key_prefix_size unodb::detail::key_prefix<unodb::detail::basic_art_key<std::span<const std::byte>>, unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::critical_section_policy>::length() const [ArtKey = unodb::detail::basic_art_key<std::span<const std::byte>>, CriticalSectionPolicy = unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::critical_section_policy]"
               );
}

Assistant:

constexpr void prepend(const key_prefix &prefix1,
                         std::byte prefix2) noexcept {
    UNODB_DETAIL_ASSERT(length() + prefix1.length() < key_prefix_capacity);

    const auto prefix1_bit_length = prefix1.length() * 8U;
    const auto prefix1_mask = (1ULL << prefix1_bit_length) - 1;
    const auto prefix3_bit_length = length() * 8U;
    const auto prefix3_mask = (1ULL << prefix3_bit_length) - 1;
    const auto prefix3 = u64 & prefix3_mask;
    const auto shifted_prefix3 = prefix3 << (prefix1_bit_length + 8U);
    const auto shifted_prefix2 = static_cast<std::uint64_t>(prefix2)
                                 << prefix1_bit_length;
    const auto masked_prefix1 = prefix1.u64 & prefix1_mask;

    u64 = shifted_prefix3 | shifted_prefix2 | masked_prefix1 |
          length_to_word(length() + prefix1.length() + 1U);

    UNODB_DETAIL_ASSERT(f.key_prefix_length.load() <= key_prefix_capacity);
  }